

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O0

void __thiscall
booster::thread_specific_ptr<icu_70::SimpleDateFormat>::reset
          (thread_specific_ptr<icu_70::SimpleDateFormat> *this,SimpleDateFormat *new_val)

{
  SimpleDateFormat *pSVar1;
  key *in_RDI;
  SimpleDateFormat *p;
  void *in_stack_ffffffffffffffd8;
  
  pSVar1 = get((thread_specific_ptr<icu_70::SimpleDateFormat> *)0x26c3ed);
  if (pSVar1 != (SimpleDateFormat *)0x0) {
    destructor(in_RDI);
  }
  intrusive_ptr<booster::details::key>::operator->((intrusive_ptr<booster::details::key> *)in_RDI);
  details::key::set(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void reset(T *new_val = 0)
		{
			T *p = get();
			if(p)
				destructor(p);
			key_->set(static_cast<void *>(new_val));
		}